

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmJoin<cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,std::char_traits<char>>>>>
                   (string *__return_storage_ptr__,
                   cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *rng,string_view separator)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  ostringstream os;
  ostream oStack_1a8;
  
  if ((rng->Begin)._M_node == (rng->End)._M_node) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
    p_Var2 = (rng->Begin)._M_node;
    p_Var1 = (rng->End)._M_node;
    std::__ostream_insert<char,std::char_traits<char>>
              (&oStack_1a8,(char *)p_Var2[1]._M_parent,*(long *)(p_Var2 + 1));
    while( true ) {
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      if (p_Var2 == p_Var1) break;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (&oStack_1a8,separator._M_str,separator._M_len);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(char *)p_Var2[1]._M_parent,*(long *)(p_Var2 + 1));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& rng, cm::string_view separator)
{
  if (rng.empty()) {
    return std::string();
  }

  std::ostringstream os;
  auto it = rng.begin();
  auto const end = rng.end();
  os << *it;
  while (++it != end) {
    os << separator << *it;
  }
  return os.str();
}